

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O0

CURLcode Curl_client_write(Curl_easy *data,int type,char *ptr,size_t len)

{
  CURLcode CVar1;
  size_t local_28;
  size_t len_local;
  char *ptr_local;
  int type_local;
  Curl_easy *data_local;
  
  local_28 = len;
  if ((((type & 1U) != 0) && ((data->conn->handler->protocol & 0xc) != 0)) &&
     ((data->conn->proto).ftpc.transfertype == 'A')) {
    local_28 = convert_lineends(data,ptr,len);
  }
  CVar1 = chop_write(data,type,ptr,local_28);
  return CVar1;
}

Assistant:

CURLcode Curl_client_write(struct Curl_easy *data,
                           int type,
                           char *ptr,
                           size_t len)
{
#if !defined(CURL_DISABLE_FTP) && defined(CURL_DO_LINEEND_CONV)
  /* FTP data may need conversion. */
  if((type & CLIENTWRITE_BODY) &&
     (data->conn->handler->protocol & PROTO_FAMILY_FTP) &&
     data->conn->proto.ftpc.transfertype == 'A') {
    /* convert end-of-line markers */
    len = convert_lineends(data, ptr, len);
  }
#endif
  return chop_write(data, type, ptr, len);
}